

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_object_property_name(parser *p)

{
  undefined8 *puVar1;
  char *pcVar2;
  void *pvVar3;
  undefined8 *v;
  long lVar4;
  
  pcVar2 = parser_getstr(p,"name");
  pvVar3 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0xf0);
  *v = pvVar3;
  parser_setpriv(p,v);
  pcVar2 = string_make(pcVar2);
  v[0x16] = pcVar2;
  lVar4 = 8;
  do {
    puVar1 = (undefined8 *)((long)v + lVar4 * 4);
    *puVar1 = 0x100000001;
    puVar1[1] = 0x100000001;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x2c);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_object_property_name(struct parser *p) {
	const char *name = parser_getstr(p, "name");
	struct obj_property *h = parser_priv(p);
	struct obj_property *prop = mem_zalloc(sizeof *prop);
	int i;

	prop->next = h;
	parser_setpriv(p, prop);
	prop->name = string_make(name);

	/* Set all the type multipliers to the default of 1 */
	for (i = 0; i < TV_MAX; i++) {
		prop->type_mult[i] = 1;
	}
	return PARSE_ERROR_NONE;
}